

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompression.cpp
# Opt level: O0

void __thiscall
Imf_3_4::CompressionDesc::CompressionDesc
          (CompressionDesc *this,string *_name,string *_desc,int _scanlines,bool _lossy,bool _deep)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,in_RDX);
  *(undefined4 *)(in_RDI + 0x40) = in_ECX;
  in_RDI[0x44] = (string)(in_R8B & 1);
  in_RDI[0x45] = (string)(in_R9B & 1);
  return;
}

Assistant:

CompressionDesc (
        std::string _name,
        std::string _desc,
        int         _scanlines,
        bool        _lossy,
        bool        _deep)
    {
        name         = _name;
        desc         = _desc;
        numScanlines = _scanlines;
        lossy        = _lossy;
        deep         = _deep;
    }